

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_reduce_2k_setup(mp_int *a,mp_digit *d)

{
  int iVar1;
  undefined8 *in_RSI;
  mp_int *in_RDI;
  mp_int tmp;
  int p;
  int res;
  mp_int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  mp_int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mp_init(in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    mp_count_bits(in_RDI);
    iVar1 = mp_2expt(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    if (iVar1 == 0) {
      iVar1 = s_mp_sub((mp_int *)tmp._8_8_,(mp_int *)tmp._0_8_,
                       (mp_int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 == 0) {
        *in_RSI = *(undefined8 *)in_stack_ffffffffffffffd8;
        mp_clear((mp_int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        iVar1 = 0;
      }
      else {
        mp_clear((mp_int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
    }
    else {
      mp_clear((mp_int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
  }
  return iVar1;
}

Assistant:

int mp_reduce_2k_setup(mp_int *a, mp_digit *d)
{
   int res, p;
   mp_int tmp;
   
   if ((res = mp_init(&tmp)) != MP_OKAY) {
      return res;
   }
   
   p = mp_count_bits(a);
   if ((res = mp_2expt(&tmp, p)) != MP_OKAY) {
      mp_clear(&tmp);
      return res;
   }
   
   if ((res = s_mp_sub(&tmp, a, &tmp)) != MP_OKAY) {
      mp_clear(&tmp);
      return res;
   }
   
   *d = tmp.dp[0];
   mp_clear(&tmp);
   return MP_OKAY;
}